

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QDockWidget * __thiscall QList<QDockWidget_*>::takeAt(QList<QDockWidget_*> *this,qsizetype i)

{
  QDockWidget *pQVar1;
  reference ppQVar2;
  char *in_RSI;
  QList<QDockWidget_*> *in_RDI;
  QDockWidget *t;
  qsizetype in_stack_ffffffffffffffd8;
  
  ppQVar2 = operator[](in_RDI,in_stack_ffffffffffffffd8);
  pQVar1 = *ppQVar2;
  remove(in_RDI,in_RSI);
  return pQVar1;
}

Assistant:

T takeAt(qsizetype i) { T t = std::move((*this)[i]); remove(i); return t; }